

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFunc.c
# Opt level: O1

void Abc_ConvertAigToGia_rec2(Hop_Obj_t *pObj)

{
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                  ,0x3b2,"void Abc_ConvertAigToGia_rec2(Hop_Obj_t *)");
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) == 0x14) {
    Abc_ConvertAigToGia_rec2((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe));
    Abc_ConvertAigToGia_rec2((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe));
    if ((*(uint *)&pObj->field_0x20 & 0x10) == 0) {
      __assert_fail("Hop_ObjIsMarkA(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abcFunc.c"
                    ,0x3b7,"void Abc_ConvertAigToGia_rec2(Hop_Obj_t *)");
    }
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef;
  }
  return;
}

Assistant:

void Abc_ConvertAigToGia_rec2( Hop_Obj_t * pObj )
{
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return;
    Abc_ConvertAigToGia_rec2( Hop_ObjFanin0(pObj) ); 
    Abc_ConvertAigToGia_rec2( Hop_ObjFanin1(pObj) );
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
}